

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  uint uVar2;
  int g_a;
  int iVar3;
  uint uVar4;
  MPI_Comm poVar5;
  void *buf;
  void *__ptr;
  long lVar6;
  int ld [1];
  int hi [1];
  int lo [1];
  int chunk [1];
  int dims [1];
  int local_50 [5];
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  
  local_50[0] = 1;
  MPI_Init(local_3c,local_38);
  GA_Initialize();
  uVar2 = GA_Nodeid();
  GA_Nnodes();
  poVar5 = GA_MPI_Comm_pgroup_default();
  printf("%d: Hello world!\n",(ulong)uVar2);
  if (uVar2 == 0) {
    printf("%d: GA_Initialize\n",0);
    printf("%d: GA_Create_handle\n",0);
    g_a = GA_Create_handle();
    printf("%d: GA_Set_array_name\n",0);
    GA_Set_array_name(g_a,"test array A");
    local_50[4] = 0x1e;
    printf("%d: GA_Set_data\n",0);
    GA_Set_data(g_a,1,local_50 + 4,0x3ec);
    local_50[3] = 0xffffffff;
    printf("%d: GA_Set_chunk\n",0);
    GA_Set_chunk(g_a,local_50 + 3);
    printf("%d: GA_Pgroup_get_world\n",0);
    iVar3 = GA_Pgroup_get_world();
    printf("%d: GA_Set_pgroup\n",0);
    GA_Set_pgroup(g_a,iVar3);
    printf("%d: GA_Allocate\n",0);
  }
  else {
    g_a = GA_Create_handle();
    GA_Set_array_name(g_a,"test array A");
    local_50[4] = 0x1e;
    GA_Set_data(g_a,1,local_50 + 4,0x3ec);
    local_50[3] = 0xffffffff;
    GA_Set_chunk(g_a,local_50 + 3);
    iVar3 = GA_Pgroup_get_world();
    GA_Set_pgroup(g_a,iVar3);
  }
  iVar3 = GA_Allocate(g_a);
  if (iVar3 == 0) {
    MPI_Abort(poVar5,100);
  }
  if (uVar2 == 0) {
    printf("%d: GA_Zero\n",0);
    GA_Zero(g_a);
    printf("%d: GA_Sync\n",0);
  }
  else {
    GA_Zero(g_a);
  }
  GA_Sync();
  buf = malloc(0x50);
  if (buf == (void *)0x0) {
    MPI_Abort(poVar5,1000);
  }
  __ptr = malloc(0x50);
  if (__ptr == (void *)0x0) {
    MPI_Abort(poVar5,2000);
  }
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)buf + lVar6 * 8);
    *puVar1 = 0x401c000000000000;
    puVar1[1] = 0x401c000000000000;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 10);
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)__ptr + lVar6 * 8);
    *puVar1 = 0x4008000000000000;
    puVar1[1] = 0x4008000000000000;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 10);
  uVar4 = GA_Create_mutexes(0x11);
  if (uVar2 == 0) {
    printf("%d: GA_Create_mutexes = %d\n",0,(ulong)uVar4);
    printf("%d: before GA_Lock\n",0);
    GA_Lock(0);
    local_50[2] = 0;
    local_50[1] = 9;
    GA_Init_fence();
    NGA_Put(g_a,local_50 + 2,local_50 + 1,buf,local_50);
    GA_Fence();
    GA_Unlock(0);
    printf("%d: after GA_Unlock\n",0);
    GA_Print(g_a);
    uVar2 = GA_Destroy_mutexes();
    printf("%d: GA_Destroy_mutexes = %d\n",0,(ulong)uVar2);
    free(__ptr);
    free(buf);
    printf("%d: GA_Destroy\n",0);
    GA_Destroy(g_a);
    printf("%d: GA_Terminate\n",0);
    GA_Terminate();
    printf("%d: MPI_Finalize\n",0);
  }
  else {
    GA_Print(g_a);
    if (uVar2 == 1) {
      lVar6 = 0;
      printf("%d: before GA_Lock\n",1);
      GA_Lock(0);
      local_50[2] = 0;
      local_50[1] = 9;
      GA_Init_fence();
      NGA_Get(g_a,local_50 + 2,local_50 + 1,__ptr,local_50);
      GA_Fence();
      GA_Unlock(0);
      printf("%d: after GA_Unlock\n",1);
      do {
        printf("p2[%2lu] = %20.10f\n",(int)*(undefined8 *)((long)__ptr + lVar6 * 8),lVar6);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
    }
    GA_Destroy_mutexes();
    free(__ptr);
    free(buf);
    GA_Destroy(g_a);
    GA_Terminate();
  }
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int me;
    int nproc;
    int status;
    int g_a;
    int dims[NDIM];
    int chunk[NDIM];
    int pg_world;
    size_t num = 10;
    double *p1 = NULL;
    double *p2 = NULL;
    size_t i;
    int num_mutex;
    int lo[1];
    int hi[1];
    int ld[1]={1};
    MPI_Comm comm;

    MP_INIT(argc,argv);
    GA_INIT(argc,argv);

    me = GA_Nodeid();
    nproc = GA_Nnodes();
    comm = GA_MPI_Comm_pgroup_default();

    printf("%d: Hello world!\n",me);

    if (me==0) printf("%d: GA_Initialize\n",me);
    /*if (me==0) printf("%d: ARMCI_Init\n",me);*/
    /*ARMCI_Init();*/
    /*if (me==0) printf("%d: MA_Init\n",me);*/
    /*MA_init(MT_DBL, 8*1024*1024, 2*1024*1024);*/

    if (me==0) printf("%d: GA_Create_handle\n",me);
    g_a = GA_Create_handle();

    if (me==0) printf("%d: GA_Set_array_name\n",me);
    GA_Set_array_name(g_a,"test array A");

    dims[0] = 30;
    if (me==0) printf("%d: GA_Set_data\n",me);
    GA_Set_data(g_a,NDIM,dims,MT_DBL);

    chunk[0] = -1;
    if (me==0) printf("%d: GA_Set_chunk\n",me);
    GA_Set_chunk(g_a,chunk);

    if (me==0) printf("%d: GA_Pgroup_get_world\n",me);
    pg_world = GA_Pgroup_get_world();
    if (me==0) printf("%d: GA_Set_pgroup\n",me);
    GA_Set_pgroup(g_a,pg_world);

    if (me==0) printf("%d: GA_Allocate\n",me);
    status = GA_Allocate(g_a);
    if(0 == status) MPI_Abort(comm,100);

    if (me==0) printf("%d: GA_Zero\n",me);
    GA_Zero(g_a);

    if (me==0) printf("%d: GA_Sync\n",me);
    GA_Sync();

    num = 10;
    p1 = malloc(num*sizeof(double));
    /*double* p1 = ARMCI_Malloc_local(num*sizeof(double));*/
    if (p1==NULL) MPI_Abort(comm,1000);
    p2 = malloc(num*sizeof(double));
    /*double* p2 = ARMCI_Malloc_local(num*sizeof(double));*/
    if (p2==NULL) MPI_Abort(comm,2000);

    for ( i=0 ; i<num ; i++ ) p1[i] = 7.0;
    for ( i=0 ; i<num ; i++ ) p2[i] = 3.0;

    num_mutex = 17;
    status = GA_Create_mutexes(num_mutex);
    if (me==0) printf("%d: GA_Create_mutexes = %d\n",me,status);

/***************************************************************/
    if (me==0) {
        printf("%d: before GA_Lock\n",me);
        GA_Lock(0);
        lo[0] = 0;
        hi[0] = num-1;
        GA_Init_fence();
        NGA_Put(g_a,lo,hi,p1,ld);
        GA_Fence();
        GA_Unlock(0);
        printf("%d: after GA_Unlock\n",me);
    } 
    GA_Print(g_a);
    if (me==1) {
        printf("%d: before GA_Lock\n",me);
        GA_Lock(0);
        lo[0] = 0;
        hi[0] = num-1;
        GA_Init_fence();
        NGA_Get(g_a,lo,hi,p2,ld);
        GA_Fence();
        GA_Unlock(0);
        printf("%d: after GA_Unlock\n",me);
        for ( i=0 ; i<num ; i++ ) printf("p2[%2lu] = %20.10f\n",
                (long unsigned)i,p2[i]);
    }
/***************************************************************/



    status = GA_Destroy_mutexes();
    if (me==0) printf("%d: GA_Destroy_mutexes = %d\n",me,status);

    /*ARMCI_Free(p2);*/
    /*ARMCI_Free(p1);*/
    free(p2);
    free(p1);

    if (me==0) printf("%d: GA_Destroy\n",me);
    GA_Destroy(g_a);

    /*if (me==0) printf("%d: ARMCI_Finalize\n",me);*/
    /*ARMCI_Finalize();*/
    if (me==0) printf("%d: GA_Terminate\n",me);
    GA_Terminate();
    if (me==0) printf("%d: MPI_Finalize\n",me);
    MPI_Finalize();

    return(0);
}